

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srtStreamReader.cpp
# Opt level: O2

uint8_t * __thiscall SRTStreamReader::renderNextMessage(SRTStreamReader *this,uint32_t *renderedLen)

{
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  string *text;
  char cVar1;
  size_type sVar2;
  bool bVar3;
  string *psVar4;
  uint8_t *puVar5;
  ostream *poVar6;
  undefined4 *puVar7;
  ParseState PVar8;
  size_type sVar9;
  string *text_00;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream ss;
  
  text_00 = (this->m_sourceText).c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar4 = (this->m_sourceText).c.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar4 == text_00) {
    return (uint8_t *)0x0;
  }
  this_00 = &this->m_sourceText;
  PVar8 = this->m_state;
  if (PVar8 == PARSE_FIRST_LINE) {
    while( true ) {
      if (psVar4 == text_00) {
        return (uint8_t *)0x0;
      }
      sVar2 = text_00->_M_string_length;
      if (sVar2 != 0) break;
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front(&this_00->c);
      this->m_processedSize =
           this->m_processedSize +
           *(this->m_origSize).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
      std::deque<int,_std::allocator<int>_>::pop_front(&(this->m_origSize).c);
      text_00 = (this->m_sourceText).c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      psVar4 = (this->m_sourceText).c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    }
    this->m_state = PARSE_TIME;
    sVar9 = 0;
    do {
      if (sVar2 == sVar9) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_front(&this_00->c);
        this->m_processedSize =
             this->m_processedSize +
             *(this->m_origSize).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
        std::deque<int,_std::allocator<int>_>::pop_front(&(this->m_origSize).c);
        text_00 = (this->m_sourceText).c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
        psVar4 = (this->m_sourceText).c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar4 == text_00) {
          return (uint8_t *)0x0;
        }
        PVar8 = this->m_state;
        goto LAB_001d5b0b;
      }
      cVar1 = (text_00->_M_dataplus)._M_p[sVar9];
      sVar9 = sVar9 + 1;
    } while (cVar1 == ' ' || (byte)(cVar1 - 0x30U) < 10);
  }
  else {
LAB_001d5b0b:
    if (PVar8 != PARSE_TIME) goto LAB_001d5bea;
  }
  bVar3 = parseTime(this,text_00);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar6 = std::operator<<((ostream *)&ss,"Invalid SRT format. \"");
    poVar6 = std::operator<<(poVar6,(((this->m_sourceText).c.
                                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur)->_M_dataplus)
                                    ._M_p);
    std::operator<<(poVar6,"\" is invalid timing info");
    puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar7 = 3;
    *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
    if (local_1c8 == &local_1b8) {
      puVar7[6] = local_1b8;
      puVar7[7] = uStack_1b4;
      puVar7[8] = uStack_1b0;
      puVar7[9] = uStack_1ac;
    }
    else {
      *(uint **)(puVar7 + 2) = local_1c8;
      *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1b4,local_1b8);
    }
    *(undefined8 *)(puVar7 + 4) = local_1c0;
    local_1b8 = local_1b8 & 0xffffff00;
    __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  this->m_state = PARSE_TEXT;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_front(&this_00->c);
  this->m_processedSize =
       this->m_processedSize +
       *(this->m_origSize).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur;
  std::deque<int,_std::allocator<int>_>::pop_front(&(this->m_origSize).c);
  text_00 = (this->m_sourceText).c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar4 = (this->m_sourceText).c.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar4 == text_00) {
    return (uint8_t *)0x0;
  }
LAB_001d5bea:
  text = &this->m_renderedText;
  while (psVar4 != text_00) {
    if (text_00->_M_string_length == 0) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front(&this_00->c);
      this->m_processedSize =
           this->m_processedSize +
           *(this->m_origSize).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
      std::deque<int,_std::allocator<int>_>::pop_front(&(this->m_origSize).c);
      puVar5 = text_subtitles::TextToPGSConverter::doConvert
                         (this->m_srtRender,text,&this->m_animation,this->m_inTime,this->m_outTime,
                          renderedLen);
      this->m_state = PARSE_FIRST_LINE;
      (this->m_renderedText)._M_string_length = 0;
      *(this->m_renderedText)._M_dataplus._M_p = '\0';
      return puVar5;
    }
    if ((this->m_renderedText)._M_string_length != 0) {
      std::__cxx11::string::push_back((char)text);
    }
    std::__cxx11::string::append((string *)text);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&this_00->c);
    this->m_processedSize =
         this->m_processedSize +
         *(this->m_origSize).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur;
    std::deque<int,_std::allocator<int>_>::pop_front(&(this->m_origSize).c);
    text_00 = (this->m_sourceText).c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar4 = (this->m_sourceText).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  }
  if ((this->m_lastBlock == true) && ((this->m_renderedText)._M_string_length != 0)) {
    this->m_state = PARSE_FIRST_LINE;
    (this->m_renderedText)._M_string_length = 0;
    *(this->m_renderedText)._M_dataplus._M_p = '\0';
    puVar5 = text_subtitles::TextToPGSConverter::doConvert
                       (this->m_srtRender,text,&this->m_animation,this->m_inTime,this->m_outTime,
                        renderedLen);
    return puVar5;
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t* SRTStreamReader::renderNextMessage(uint32_t& renderedLen)
{
    uint8_t* rez = nullptr;
    if (m_sourceText.empty())
        return nullptr;
    if (m_state == ParseState::PARSE_FIRST_LINE)
    {
        while (!m_sourceText.empty() && m_sourceText.front().empty())
        {
            m_sourceText.pop();  // delete empty lines before message
            m_processedSize += m_origSize.front();
            m_origSize.pop();
        }
        if (m_sourceText.empty())
            return nullptr;
        m_state = ParseState::PARSE_TIME;
        bool isNUmber = true;
        {
            for (const auto& c : m_sourceText.front())
                if (!(c >= '0' && c <= '9') && c != ' ')
                {
                    isNUmber = false;
                    break;
                }
        }
        if (isNUmber)
        {
            m_sourceText.pop();
            m_processedSize += m_origSize.front();
            m_origSize.pop();
            if (m_sourceText.empty())
                return nullptr;
        }
    }
    if (m_state == ParseState::PARSE_TIME)
    {
        if (!parseTime(m_sourceText.front()))
            THROW(ERR_COMMON, "Invalid SRT format. \"" << m_sourceText.front().c_str() << "\" is invalid timing info")
        m_state = ParseState::PARSE_TEXT;
        m_sourceText.pop();
        m_processedSize += m_origSize.front();
        m_origSize.pop();
        if (m_sourceText.empty())
            return nullptr;
    }

    while (!m_sourceText.empty() && !m_sourceText.front().empty())
    {
        if (!m_renderedText.empty())
            m_renderedText += '\n';
        m_renderedText += m_sourceText.front();
        m_sourceText.pop();
        m_processedSize += m_origSize.front();
        m_origSize.pop();
    }

    if (m_sourceText.empty())
    {
        if (m_lastBlock && !m_renderedText.empty())
        {
            m_state = ParseState::PARSE_FIRST_LINE;
            m_renderedText.clear();
            rez = m_srtRender->doConvert(m_renderedText, m_animation, m_inTime, m_outTime, renderedLen);
        }
        return rez;
    }
    m_sourceText.pop();  // delete empty line (messages separator)
    m_processedSize += m_origSize.front();
    m_origSize.pop();
    rez = m_srtRender->doConvert(m_renderedText, m_animation, m_inTime, m_outTime, renderedLen);
    m_state = ParseState::PARSE_FIRST_LINE;
    m_renderedText.clear();
    return rez;
}